

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.hpp
# Opt level: O3

void __thiscall clipp::detail::scoped_dfs_traverser::check_if_left_scope(scoped_dfs_traverser *this)

{
  memento *pmVar1;
  bool bVar2;
  pointer pcVar3;
  pointer pcVar4;
  int iVar5;
  int iVar6;
  _Elt_pointer pmVar7;
  
  pcVar3 = (this->posAfterLastMatch_).stack_.
           super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pcVar4 = (this->posAfterLastMatch_).stack_.
           super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((pcVar3 != pcVar4) &&
     (iVar5 = (int)((ulong)((long)(this->pos_).stack_.
                                  super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->pos_).stack_.
                                 super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555,
     iVar6 = (int)((ulong)((long)pcVar4 - (long)pcVar3) >> 3),
     SBORROW4(iVar5,iVar6 * -0x55555555) != iVar5 + iVar6 * 0x55555555 < 0)) {
    pmVar7 = (this->scopes_).c.
             super__Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pmVar7 != (this->scopes_).c.
                  super__Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur) {
      do {
        if (pmVar7 == (this->scopes_).c.
                      super__Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_first) {
          pmVar1 = (this->scopes_).c.
                   super__Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
          if (pmVar1[0xf].level_ <
              (int)((ulong)((long)(this->pos_).stack_.
                                  super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->pos_).stack_.
                                 super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555)
          break;
          pmVar7 = pmVar1 + 0x10;
        }
        else if (pmVar7[-1].level_ <
                 (int)((ulong)((long)(this->pos_).stack_.
                                     super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->pos_).stack_.
                                    super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555)
        break;
        group::depth_first_traverser::undo(&this->pos_,pmVar7 + -1);
        std::
        deque<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
        ::pop_back(&(this->scopes_).c);
        pmVar7 = (this->scopes_).c.
                 super__Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      } while (pmVar7 != (this->scopes_).c.
                         super__Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
                         ._M_impl.super__Deque_impl_data._M_start._M_cur);
      pcVar3 = (this->posAfterLastMatch_).stack_.
               super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pcVar4 = (this->posAfterLastMatch_).stack_.
               super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    if (pcVar4 != pcVar3) {
      (this->posAfterLastMatch_).stack_.
      super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
      ._M_impl.super__Vector_impl_data._M_finish = pcVar3;
    }
  }
  pmVar7 = (this->scopes_).c.
           super__Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pmVar7 != (this->scopes_).c.
                super__Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    do {
      if (pmVar7 == (this->scopes_).c.
                    super__Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pmVar1 = (this->scopes_).c.
                 super__Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
        if (pmVar1[0xf].level_ <=
            (int)((ulong)((long)(this->pos_).stack_.
                                super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->pos_).stack_.
                               super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555)
        break;
        pmVar7 = pmVar1 + 0x10;
      }
      else if (pmVar7[-1].level_ <=
               (int)((ulong)((long)(this->pos_).stack_.
                                   super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->pos_).stack_.
                                  super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555)
      break;
      group::depth_first_traverser::undo(&this->pos_,pmVar7 + -1);
      std::
      deque<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
      ::pop_back(&(this->scopes_).c);
      pmVar7 = (this->scopes_).c.
               super__Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    } while (pmVar7 != (this->scopes_).c.
                       super__Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  bVar2 = repeat_group_continues(this);
  this->repeatGroupContinues_ = bVar2;
  return;
}

Assistant:

void check_if_left_scope()
    {
        if(posAfterLastMatch_) {
            if(pos_.level() < posAfterLastMatch_.level()) {
                while(!scopes_.empty() && scopes_.top().level() >= pos_.level()) {
                    pos_.undo(scopes_.top());
                    scopes_.pop();
                }
                posAfterLastMatch_.invalidate();
            }
        }
        while(!scopes_.empty() && scopes_.top().level() > pos_.level()) {
            pos_.undo(scopes_.top());
            scopes_.pop();
        }
        repeatGroupContinues_ = repeat_group_continues();
    }